

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type * __thiscall
QList<QByteArray>::takeFirst(value_type *__return_storage_ptr__,QList<QByteArray> *this)

{
  iterator other;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  other = begin(this);
  QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&(other.i)->d);
  QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst((QGenericArrayOps<QByteArray> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }